

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

string * spdlog::details::os::filename_to_str(filename_t *filename)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  
  std::__cxx11::string::string(in_stack_00000030,in_stack_00000028);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE std::string filename_to_str(const filename_t &filename) { return filename; }